

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_draw.cpp
# Opt level: O3

void __thiscall
DCanvas::FillSimplePoly
          (DCanvas *this,FTexture *tex,FVector2 *points,int npoints,double originx,double originy,
          double scalex,double scaley,DAngle *rotation,FDynamicColormap *colormap,int lightlevel,
          int bottomclip)

{
  float fVar1;
  float fVar2;
  double dVar3;
  short sVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  uint uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [16];
  undefined8 uVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  uint uVar21;
  int iVar22;
  int iVar23;
  ulong uVar24;
  undefined1 *colormap_00;
  ulong uVar25;
  long lVar26;
  int iVar27;
  uint uVar28;
  ulong uVar29;
  uint uVar30;
  bool bVar31;
  double dVar32;
  double dVar33;
  undefined1 auVar34 [16];
  double dVar35;
  double dVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  double dVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  double dVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  int iVar55;
  int iVar57;
  undefined1 auVar56 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar65 [16];
  float fVar66;
  float fVar67;
  int iVar68;
  int iVar69;
  int iVar70;
  int iVar71;
  int iVar72;
  int iVar73;
  int iVar74;
  undefined1 auVar75 [16];
  int iVar76;
  int iVar78;
  int iVar79;
  undefined1 auVar77 [16];
  int iVar80;
  undefined1 in_XMM15 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  double local_c0;
  double local_b8;
  double local_a0;
  short sVar58;
  short sVar63;
  short sVar64;
  
  uVar17 = swrenderer::drawerargs::dc_destorg;
  if ((2 < npoints) && (this->Buffer != (BYTE *)0x0)) {
    dVar3 = rotation->Degrees;
    uVar30 = npoints - 1;
    uVar24 = 0;
    uVar20 = 1;
    uVar29 = 0;
    fVar66 = points->Y;
    fVar13 = points->X;
    fVar14 = points->Y;
    fVar15 = points->X;
    do {
      auVar59 = ZEXT416((uint)fVar15);
      auVar65 = ZEXT416((uint)fVar13);
      fVar1 = points[uVar20].Y;
      if (fVar1 < fVar66) {
        uVar24 = uVar20 & 0xffffffff;
      }
      fVar2 = points[uVar20].X;
      if (fVar14 < fVar1) {
        uVar29 = uVar20 & 0xffffffff;
      }
      fVar67 = fVar1;
      if (fVar66 <= fVar1) {
        fVar67 = fVar66;
      }
      if (fVar1 <= fVar14) {
        fVar1 = fVar14;
      }
      fVar12 = fVar2;
      if (fVar13 <= fVar2) {
        fVar12 = fVar13;
      }
      if (fVar2 <= fVar15) {
        fVar2 = fVar15;
      }
      uVar20 = uVar20 + 1;
      fVar66 = fVar67;
      fVar13 = fVar12;
      fVar14 = fVar1;
      fVar15 = fVar2;
    } while ((uint)npoints != uVar20);
    uVar11 = this->Height;
    if (0 < bottomclip) {
      uVar11 = bottomclip;
    }
    if ((((fVar67 < (float)(int)uVar11) && (0.0 < fVar1)) && (fVar12 < (float)this->Width)) &&
       (0.0 < fVar2)) {
      swrenderer::drawerargs::dc_destorg = (screen->super_DSimpleCanvas).super_DCanvas.Buffer;
      dVar32 = dVar3;
      if (swrenderer::drawerargs::dc_destorg == (BYTE *)0x0) {
        I_FatalError("Attempt to write to buffer of hardware canvas");
        dVar32 = rotation->Degrees;
      }
      dVar35 = (tex->Scale).X;
      dVar49 = (tex->Scale).Y;
      dVar32 = cos(dVar32 * 0.017453292519943295);
      dVar33 = sin(rotation->Degrees * 0.017453292519943295);
      swrenderer::R_SetupSpanBits(tex);
      if (colormap == (FDynamicColormap *)0x0) {
        colormap_00 = swrenderer::identitymap;
      }
      else {
        uVar21 = lightlevel * -0x4000 + 0x310000 >> 0x10;
        uVar18 = 0x1f;
        if (uVar21 < 0x1f) {
          uVar18 = uVar21;
        }
        uVar20 = 0;
        if (0 < (int)uVar21) {
          uVar20 = (ulong)(uVar18 << 8);
        }
        colormap_00 = colormap->Maps + uVar20;
      }
      swrenderer::R_SetSpanColormap(colormap_00);
      swrenderer::R_SetSpanSource(tex);
      auVar16 = _DAT_005d6240;
      local_b8 = 0.0;
      swrenderer::drawerargs::ds_ystep = 0;
      swrenderer::drawerargs::ds_xstep = 0;
      local_a0 = 0.0;
      if (swrenderer::drawerargs::ds_xbits != 0) {
        local_a0 = (double)(uint)(1 << (-(char)swrenderer::drawerargs::ds_xbits & 0x1fU)) /
                   (scalex / dVar35);
        swrenderer::drawerargs::ds_xstep = SUB84(dVar32 * local_a0 + 1.5e-08 + 6755399441055744.0,0)
        ;
      }
      if (swrenderer::drawerargs::ds_ybits != 0) {
        local_b8 = (double)(uint)(1 << (-(char)swrenderer::drawerargs::ds_ybits & 0x1fU)) /
                   (scaley / dVar49);
        swrenderer::drawerargs::ds_ystep = SUB84(dVar33 * local_b8 + 1.5e-08 + 6755399441055744.0,0)
        ;
      }
      iVar22 = (int)uVar24;
      uVar18 = iVar22 + 1;
      if ((int)uVar30 <= iVar22) {
        uVar18 = 0;
      }
      local_c0 = (double)(points[iVar22].Y + 0.5) + 1.5e-08 + 6755399441055744.0;
      auVar34 = pshuflw(ZEXT416((uint)this->Width),ZEXT416((uint)this->Width),0);
      dVar35 = local_c0;
      uVar20 = uVar24;
      do {
        dVar49 = (double)(points[(int)uVar18].Y + 0.5) + 1.5e-08 + 6755399441055744.0;
        uVar19 = SUB84(dVar35,0);
        uVar21 = SUB84(dVar49,0);
        if (((int)uVar19 < (int)uVar21) &&
           ((int)uVar19 < (int)uVar11 && -1 < (int)(uVar19 & uVar21))) {
          uVar28 = uVar11;
          if ((int)uVar21 < (int)uVar11) {
            uVar28 = uVar21;
          }
          uVar21 = 0;
          if (0 < (int)uVar19) {
            uVar21 = uVar19;
          }
          if ((int)uVar21 < (int)uVar28) {
            dVar35 = (double)((points[(int)uVar18].X - points[(int)uVar20].X) /
                             (points[(int)uVar18].Y - points[(int)uVar20].Y)) + 103079215104.0;
            uVar25 = (ulong)uVar21;
            iVar23 = SUB84(dVar35,0);
            iVar27 = SUB84((double)(points[(int)uVar20].X + 0.5) + 103079215104.0,0) -
                     ((int)uVar19 >> 0x1f & uVar19 * iVar23);
            lVar26 = (uVar28 - uVar25) + -1;
            auVar40._4_4_ = iVar23;
            auVar40._0_4_ = iVar23;
            auVar40._8_4_ = iVar23;
            auVar40._12_4_ = iVar23;
            auVar77._4_4_ = iVar23;
            auVar77._0_4_ = iVar23;
            auVar77._8_4_ = iVar23;
            auVar77._12_4_ = iVar23;
            auVar52._4_4_ = iVar23;
            auVar52._0_4_ = iVar23;
            auVar52._8_4_ = iVar23;
            auVar52._12_4_ = iVar23;
            auVar10._4_4_ = iVar23;
            auVar10._0_4_ = iVar23;
            auVar10._8_4_ = iVar23;
            auVar10._12_4_ = iVar23;
            iVar68 = (int)(((ulong)dVar35 & 0xffffffff) * 4) + iVar27;
            iVar69 = (int)(((ulong)dVar35 & 0xffffffff) * 5) + iVar27;
            iVar70 = (int)((auVar10._8_8_ & 0xffffffff) * 6) + iVar27;
            iVar71 = (int)((auVar52._8_8_ & 0xffffffff) * 7) + iVar27;
            iVar72 = iVar23 + iVar27;
            iVar73 = (int)((auVar77._8_8_ & 0xffffffff) * 2) + iVar27;
            iVar74 = (int)((auVar40._8_8_ & 0xffffffff) * 3) + iVar27;
            auVar48._8_4_ = (int)lVar26;
            auVar48._0_8_ = lVar26;
            auVar48._12_4_ = (int)((ulong)lVar26 >> 0x20);
            lVar26 = uVar25 * 2;
            uVar20 = 0;
            do {
              auVar37._8_4_ = (int)uVar20;
              auVar37._0_8_ = uVar20;
              auVar37._12_4_ = (int)(uVar20 >> 0x20);
              auVar77 = auVar48 ^ auVar16;
              auVar40 = (auVar37 | _DAT_005d6230) ^ auVar16;
              iVar76 = auVar77._0_4_;
              iVar55 = -(uint)(iVar76 < auVar40._0_4_);
              iVar78 = auVar77._4_4_;
              auVar42._4_4_ = -(uint)(iVar78 < auVar40._4_4_);
              iVar79 = auVar77._8_4_;
              iVar57 = -(uint)(iVar79 < auVar40._8_4_);
              iVar80 = auVar77._12_4_;
              auVar42._12_4_ = -(uint)(iVar80 < auVar40._12_4_);
              auVar50._4_4_ = iVar55;
              auVar50._0_4_ = iVar55;
              auVar50._8_4_ = iVar57;
              auVar50._12_4_ = iVar57;
              auVar77 = pshuflw(in_XMM15,auVar50,0xe8);
              auVar41._4_4_ = -(uint)(auVar40._4_4_ == iVar78);
              auVar41._12_4_ = -(uint)(auVar40._12_4_ == iVar80);
              auVar41._0_4_ = auVar41._4_4_;
              auVar41._8_4_ = auVar41._12_4_;
              auVar59 = pshuflw(auVar59,auVar41,0xe8);
              auVar42._0_4_ = auVar42._4_4_;
              auVar42._8_4_ = auVar42._12_4_;
              auVar40 = pshuflw(auVar65,auVar42,0xe8);
              auVar65._8_4_ = 0xffffffff;
              auVar65._0_8_ = 0xffffffffffffffff;
              auVar65._12_4_ = 0xffffffff;
              auVar65 = (auVar40 | auVar59 & auVar77) ^ auVar65;
              auVar40 = packssdw(auVar65,auVar65);
              auVar60._0_4_ = iVar27 >> 0x10;
              auVar60._4_4_ = iVar72 >> 0x10;
              auVar60._8_4_ = iVar73 >> 0x10;
              auVar60._12_4_ = iVar74 >> 0x10;
              auVar81._0_4_ = iVar68 >> 0x10;
              auVar81._4_4_ = iVar69 >> 0x10;
              auVar81._8_4_ = iVar70 >> 0x10;
              auVar81._12_4_ = iVar71 >> 0x10;
              auVar65 = packssdw(auVar60,auVar81);
              sVar4 = auVar34._0_2_;
              sVar58 = auVar65._0_2_;
              auVar61._0_2_ = (ushort)(sVar4 < sVar58) * sVar4 | (ushort)(sVar4 >= sVar58) * sVar58;
              sVar58 = auVar34._2_2_;
              sVar63 = auVar65._2_2_;
              auVar61._2_2_ =
                   (ushort)(sVar58 < sVar63) * sVar58 | (ushort)(sVar58 >= sVar63) * sVar63;
              sVar63 = auVar65._4_2_;
              auVar61._4_2_ = (ushort)(sVar4 < sVar63) * sVar4 | (ushort)(sVar4 >= sVar63) * sVar63;
              sVar63 = auVar65._6_2_;
              auVar61._6_2_ =
                   (ushort)(sVar58 < sVar63) * sVar58 | (ushort)(sVar58 >= sVar63) * sVar63;
              sVar63 = auVar65._8_2_;
              auVar61._8_2_ = (ushort)(sVar4 < sVar63) * sVar4 | (ushort)(sVar4 >= sVar63) * sVar63;
              sVar63 = auVar65._10_2_;
              auVar61._10_2_ =
                   (ushort)(sVar58 < sVar63) * sVar58 | (ushort)(sVar58 >= sVar63) * sVar63;
              sVar63 = auVar65._12_2_;
              sVar64 = auVar65._14_2_;
              auVar61._12_2_ = (ushort)(sVar4 < sVar63) * sVar4 | (ushort)(sVar4 >= sVar63) * sVar63
              ;
              auVar61._14_2_ =
                   (ushort)(sVar58 < sVar64) * sVar58 | (ushort)(sVar58 >= sVar64) * sVar64;
              auVar82._0_4_ = -(uint)(-1 < iVar27);
              auVar82._4_4_ = -(uint)(-1 < iVar72);
              auVar82._8_4_ = -(uint)(-1 < iVar73);
              auVar82._12_4_ = -(uint)(-1 < iVar74);
              auVar75._0_4_ = -(uint)(-1 < iVar68);
              auVar75._4_4_ = -(uint)(-1 < iVar69);
              auVar75._8_4_ = -(uint)(-1 < iVar70);
              auVar75._12_4_ = -(uint)(-1 < iVar71);
              auVar65 = packssdw(auVar82,auVar75);
              auVar59._8_4_ = 0xffffffff;
              auVar59._0_8_ = 0xffffffffffffffff;
              auVar59._12_4_ = 0xffffffff;
              in_XMM15 = auVar65 ^ auVar59 | auVar61 & auVar65;
              if ((auVar40 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                spanend[uVar25 + uVar20] = in_XMM15._0_2_;
              }
              auVar42 = auVar41 & auVar50 | auVar42;
              auVar65 = packssdw(auVar42,auVar42);
              auVar5._8_4_ = 0xffffffff;
              auVar5._0_8_ = 0xffffffffffffffff;
              auVar5._12_4_ = 0xffffffff;
              auVar65 = packssdw(auVar65 ^ auVar5,auVar65 ^ auVar5);
              if ((auVar65._0_4_ >> 0x10 & 1) != 0) {
                *(short *)(lVar26 + 0x1789f92 + uVar20 * 2) = in_XMM15._2_2_;
              }
              auVar65 = (auVar37 | _DAT_005d6f70) ^ auVar16;
              iVar55 = -(uint)(iVar76 < auVar65._0_4_);
              auVar56._4_4_ = -(uint)(iVar78 < auVar65._4_4_);
              iVar57 = -(uint)(iVar79 < auVar65._8_4_);
              auVar56._12_4_ = -(uint)(iVar80 < auVar65._12_4_);
              auVar43._4_4_ = iVar55;
              auVar43._0_4_ = iVar55;
              auVar43._8_4_ = iVar57;
              auVar43._12_4_ = iVar57;
              auVar51._4_4_ = -(uint)(auVar65._4_4_ == iVar78);
              auVar51._12_4_ = -(uint)(auVar65._12_4_ == iVar80);
              auVar51._0_4_ = auVar51._4_4_;
              auVar51._8_4_ = auVar51._12_4_;
              auVar56._0_4_ = auVar56._4_4_;
              auVar56._8_4_ = auVar56._12_4_;
              auVar65 = auVar51 & auVar43 | auVar56;
              auVar65 = packssdw(auVar65,auVar65);
              auVar6._8_4_ = 0xffffffff;
              auVar6._0_8_ = 0xffffffffffffffff;
              auVar6._12_4_ = 0xffffffff;
              auVar65 = packssdw(auVar65 ^ auVar6,auVar65 ^ auVar6);
              if ((auVar65 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                *(short *)(lVar26 + 0x1789f94 + uVar20 * 2) = in_XMM15._4_2_;
              }
              auVar59 = pshufhw(auVar43,auVar43,0x84);
              auVar52 = pshufhw(auVar51,auVar51,0x84);
              auVar77 = pshufhw(auVar59,auVar56,0x84);
              auVar44._8_4_ = 0xffffffff;
              auVar44._0_8_ = 0xffffffffffffffff;
              auVar44._12_4_ = 0xffffffff;
              auVar44 = (auVar77 | auVar52 & auVar59) ^ auVar44;
              auVar59 = packssdw(auVar44,auVar44);
              if ((auVar59 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                *(short *)(lVar26 + 0x1789f96 + uVar20 * 2) = in_XMM15._6_2_;
              }
              auVar59 = (auVar37 | _DAT_005d6f60) ^ auVar16;
              iVar55 = -(uint)(iVar76 < auVar59._0_4_);
              auVar46._4_4_ = -(uint)(iVar78 < auVar59._4_4_);
              iVar57 = -(uint)(iVar79 < auVar59._8_4_);
              auVar46._12_4_ = -(uint)(iVar80 < auVar59._12_4_);
              auVar53._4_4_ = iVar55;
              auVar53._0_4_ = iVar55;
              auVar53._8_4_ = iVar57;
              auVar53._12_4_ = iVar57;
              auVar77 = pshuflw(auVar65,auVar53,0xe8);
              auVar45._4_4_ = -(uint)(auVar59._4_4_ == iVar78);
              auVar45._12_4_ = -(uint)(auVar59._12_4_ == iVar80);
              auVar45._0_4_ = auVar45._4_4_;
              auVar45._8_4_ = auVar45._12_4_;
              auVar65 = pshuflw(auVar40,auVar45,0xe8);
              auVar65 = auVar65 & auVar77;
              auVar46._0_4_ = auVar46._4_4_;
              auVar46._8_4_ = auVar46._12_4_;
              auVar59 = pshuflw(auVar77,auVar46,0xe8);
              auVar62._8_4_ = 0xffffffff;
              auVar62._0_8_ = 0xffffffffffffffff;
              auVar62._12_4_ = 0xffffffff;
              auVar62 = (auVar59 | auVar65) ^ auVar62;
              auVar59 = packssdw(auVar62,auVar62);
              if ((auVar59 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(short *)(lVar26 + 0x1789f98 + uVar20 * 2) = in_XMM15._8_2_;
              }
              auVar46 = auVar45 & auVar53 | auVar46;
              auVar40 = packssdw(auVar46,auVar46);
              auVar7._8_4_ = 0xffffffff;
              auVar7._0_8_ = 0xffffffffffffffff;
              auVar7._12_4_ = 0xffffffff;
              auVar40 = packssdw(auVar40 ^ auVar7,auVar40 ^ auVar7);
              if ((auVar40 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                *(short *)(lVar26 + 0x1789f9a + uVar20 * 2) = in_XMM15._10_2_;
              }
              auVar40 = (auVar37 | _DAT_005d6f50) ^ auVar16;
              iVar55 = -(uint)(iVar76 < auVar40._0_4_);
              auVar54._4_4_ = -(uint)(iVar78 < auVar40._4_4_);
              iVar57 = -(uint)(iVar79 < auVar40._8_4_);
              auVar54._12_4_ = -(uint)(iVar80 < auVar40._12_4_);
              auVar47._4_4_ = iVar55;
              auVar47._0_4_ = iVar55;
              auVar47._8_4_ = iVar57;
              auVar47._12_4_ = iVar57;
              auVar38._4_4_ = -(uint)(auVar40._4_4_ == iVar78);
              auVar38._12_4_ = -(uint)(auVar40._12_4_ == iVar80);
              auVar38._0_4_ = auVar38._4_4_;
              auVar38._8_4_ = auVar38._12_4_;
              auVar54._0_4_ = auVar54._4_4_;
              auVar54._8_4_ = auVar54._12_4_;
              auVar40 = auVar38 & auVar47 | auVar54;
              auVar40 = packssdw(auVar40,auVar40);
              auVar8._8_4_ = 0xffffffff;
              auVar8._0_8_ = 0xffffffffffffffff;
              auVar8._12_4_ = 0xffffffff;
              auVar40 = packssdw(auVar40 ^ auVar8,auVar40 ^ auVar8);
              if ((auVar40 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                *(short *)(lVar26 + 0x1789f9c + uVar20 * 2) = in_XMM15._12_2_;
              }
              auVar77 = pshufhw(auVar47,auVar47,0x84);
              auVar40 = pshufhw(auVar38,auVar38,0x84);
              auVar52 = pshufhw(auVar77,auVar54,0x84);
              auVar9._8_4_ = 0xffffffff;
              auVar9._0_8_ = 0xffffffffffffffff;
              auVar9._12_4_ = 0xffffffff;
              auVar40 = packssdw(auVar40 & auVar77,(auVar52 | auVar40 & auVar77) ^ auVar9);
              if ((auVar40 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                *(short *)(lVar26 + 0x1789f9e + uVar20 * 2) = in_XMM15._14_2_;
              }
              uVar20 = uVar20 + 8;
              iVar27 = iVar27 + iVar23 * 8;
              iVar72 = iVar72 + iVar23 * 8;
              iVar73 = iVar73 + iVar23 * 8;
              iVar74 = iVar74 + iVar23 * 8;
              iVar68 = iVar68 + iVar23 * 8;
              iVar69 = iVar69 + iVar23 * 8;
              iVar70 = iVar70 + iVar23 * 8;
              iVar71 = iVar71 + iVar23 * 8;
            } while (((uVar28 - uVar25) + 7 & 0xfffffffffffffff8) != uVar20);
          }
        }
        uVar21 = uVar18 + 1;
        if ((int)uVar30 <= (int)uVar18) {
          uVar21 = 0;
        }
        uVar20 = (ulong)uVar18;
        bVar31 = uVar18 != (uint)uVar29;
        dVar35 = dVar49;
        uVar18 = uVar21;
      } while (bVar31);
      uVar18 = iVar22 - 1;
      if (iVar22 < 1) {
        uVar18 = uVar30;
      }
      do {
        dVar35 = (double)(points[uVar18].Y + 0.5) + 1.5e-08 + 6755399441055744.0;
        uVar21 = SUB84(local_c0,0);
        uVar19 = SUB84(dVar35,0);
        if (((int)uVar21 < (int)uVar19) &&
           ((int)uVar21 < (int)uVar11 && -1 < (int)(uVar19 & uVar21))) {
          uVar28 = uVar11;
          if ((int)uVar19 < (int)uVar11) {
            uVar28 = uVar19;
          }
          uVar19 = 0;
          if (0 < (int)uVar21) {
            uVar19 = uVar21;
          }
          if ((int)uVar19 < (int)uVar28) {
            iVar22 = SUB84((double)((points[uVar18].X - points[(int)uVar24].X) /
                                   (points[uVar18].Y - points[(int)uVar24].Y)) + 103079215104.0,0);
            iVar23 = SUB84((double)(points[(int)uVar24].X + 0.5) + 103079215104.0,0) -
                     ((int)uVar21 >> 0x1f & uVar21 * iVar22);
            uVar20 = (ulong)uVar19;
            do {
              iVar27 = (int)spanend[uVar20];
              if (((0 < spanend[uVar20]) && (iVar68 = iVar23 >> 0x10, iVar68 < iVar27)) &&
                 (iVar69 = this->Width, iVar68 < iVar69)) {
                if (iVar68 < 1) {
                  iVar68 = 0;
                }
                if (iVar27 < iVar69) {
                  iVar69 = iVar27;
                }
                swrenderer::drawerargs::ds_x2 = iVar69 + -1;
                swrenderer::drawerargs::ds_y = (int)uVar20;
                dVar36 = (double)iVar68 - originx;
                dVar49 = (double)swrenderer::drawerargs::ds_y - originy;
                if ((dVar3 != 0.0) || (dVar39 = dVar36, NAN(dVar3))) {
                  dVar39 = dVar32 * dVar36 - dVar33 * dVar49;
                  dVar49 = dVar49 * dVar32 + dVar36 * dVar33;
                }
                swrenderer::drawerargs::ds_xfrac =
                     SUB84(dVar39 * local_a0 + 1.5e-08 + 6755399441055744.0,0);
                swrenderer::drawerargs::ds_yfrac =
                     SUB84(dVar49 * local_b8 + 1.5e-08 + 6755399441055744.0,0);
                swrenderer::drawerargs::ds_x1 = iVar68;
                swrenderer::R_DrawSpan();
              }
              iVar23 = iVar23 + iVar22;
              uVar20 = uVar20 + 1;
            } while (uVar28 != uVar20);
          }
        }
        uVar24 = (ulong)uVar18;
        uVar21 = uVar18 - 1;
        if ((int)uVar18 < 1) {
          uVar21 = uVar30;
        }
        bVar31 = uVar18 != (uint)uVar29;
        uVar18 = uVar21;
        local_c0 = dVar35;
      } while (bVar31);
    }
  }
  swrenderer::drawerargs::dc_destorg = (BYTE *)uVar17;
  return;
}

Assistant:

void DCanvas::FillSimplePoly(FTexture *tex, FVector2 *points, int npoints,
	double originx, double originy, double scalex, double scaley, DAngle rotation,
	FDynamicColormap *colormap, int lightlevel, int bottomclip)
{
#ifndef NO_SWRENDER
	using namespace swrenderer;
	using namespace drawerargs;

	// Use an equation similar to player sprites to determine shade
	fixed_t shade = LIGHT2SHADE(lightlevel) - 12*FRACUNIT;
	float topy, boty, leftx, rightx;
	int toppt, botpt, pt1, pt2;
	int i;
	int y1, y2, y;
	fixed_t x;
	bool dorotate = rotation != 0.;
	double cosrot, sinrot;

	if (--npoints < 2 || Buffer == NULL)
	{ // not a polygon or we're not locked
		return;
	}

	if (bottomclip <= 0)
	{
		bottomclip = Height;
	}

	// Find the extents of the polygon, in particular the highest and lowest points.
	for (botpt = toppt = 0, boty = topy = points[0].Y, leftx = rightx = points[0].X, i = 1; i <= npoints; ++i)
	{
		if (points[i].Y < topy)
		{
			topy = points[i].Y;
			toppt = i;
		}
		if (points[i].Y > boty)
		{
			boty = points[i].Y;
			botpt = i;
		}
		if (points[i].X < leftx)
		{
			leftx = points[i].X;
		}
		if (points[i].X > rightx)
		{
			rightx = points[i].X;
		}
	}
	if (topy >= bottomclip ||	// off the bottom of the screen
		boty <= 0 ||			// off the top of the screen
		leftx >= Width ||		// off the right of the screen
		rightx <= 0)			// off the left of the screen
	{
		return;
	}

	BYTE *destorgsave = dc_destorg;
	dc_destorg = screen->GetBuffer();
	if (dc_destorg == NULL)
	{
		I_FatalError("Attempt to write to buffer of hardware canvas");
	}

	scalex /= tex->Scale.X;
	scaley /= tex->Scale.Y;

	// Use the CRT's functions here.
	cosrot = cos(rotation.Radians());
	sinrot = sin(rotation.Radians());

	// Setup constant texture mapping parameters.
	R_SetupSpanBits(tex);
	R_SetSpanColormap(colormap != NULL ? &colormap->Maps[clamp(shade >> FRACBITS, 0, NUMCOLORMAPS-1) * 256] : identitymap);
	R_SetSpanSource(tex);
	if (ds_xbits != 0)
	{
		scalex = double(1u << (32 - ds_xbits)) / scalex;
		ds_xstep = xs_RoundToInt(cosrot * scalex);
	}
	else
	{ // Texture is one pixel wide.
		scalex = 0;
		ds_xstep = 0;
	}
	if (ds_ybits != 0)
	{
		scaley = double(1u << (32 - ds_ybits)) / scaley;
		ds_ystep = xs_RoundToInt(sinrot * scaley);
	}
	else
	{ // Texture is one pixel tall.
		scaley = 0;
		ds_ystep = 0;
	}

	// Travel down the right edge and create an outline of that edge.
	pt1 = toppt;
	pt2 = toppt + 1;	if (pt2 > npoints) pt2 = 0;
	y1 = xs_RoundToInt(points[pt1].Y + 0.5f);
	do
	{
		x = FLOAT2FIXED(points[pt1].X + 0.5f);
		y2 = xs_RoundToInt(points[pt2].Y + 0.5f);
		if (y1 >= y2 || (y1 < 0 && y2 < 0) || (y1 >= bottomclip && y2 >= bottomclip))
		{
		}
		else
		{
			fixed_t xinc = FLOAT2FIXED((points[pt2].X - points[pt1].X) / (points[pt2].Y - points[pt1].Y));
			int y3 = MIN(y2, bottomclip);
			if (y1 < 0)
			{
				x += xinc * -y1;
				y1 = 0;
			}
			for (y = y1; y < y3; ++y)
			{
				spanend[y] = clamp<short>(x >> FRACBITS, -1, Width);
				x += xinc;
			}
		}
		y1 = y2;
		pt1 = pt2;
		pt2++;			if (pt2 > npoints) pt2 = 0;
	} while (pt1 != botpt);

	// Travel down the left edge and fill it in.
	pt1 = toppt;
	pt2 = toppt - 1;	if (pt2 < 0) pt2 = npoints;
	y1 = xs_RoundToInt(points[pt1].Y + 0.5f);
	do
	{
		x = FLOAT2FIXED(points[pt1].X + 0.5f);
		y2 = xs_RoundToInt(points[pt2].Y + 0.5f);
		if (y1 >= y2 || (y1 < 0 && y2 < 0) || (y1 >= bottomclip && y2 >= bottomclip))
		{
		}
		else
		{
			fixed_t xinc = FLOAT2FIXED((points[pt2].X - points[pt1].X) / (points[pt2].Y - points[pt1].Y));
			int y3 = MIN(y2, bottomclip);
			if (y1 < 0)
			{
				x += xinc * -y1;
				y1 = 0;
			}
			for (y = y1; y < y3; ++y)
			{
				int x1 = x >> FRACBITS;
				int x2 = spanend[y];
				if (x2 > x1 && x2 > 0 && x1 < Width)
				{
					x1 = MAX(x1, 0);
					x2 = MIN(x2, Width);
#if 0
					memset(this->Buffer + y * this->Pitch + x1, (int)tex, x2 - x1);
#else
					ds_y = y;
					ds_x1 = x1;
					ds_x2 = x2 - 1;

					DVector2 tex(x1 - originx, y - originy);
					if (dorotate)
					{
						double t = tex.X;
						tex.X = t * cosrot - tex.Y * sinrot;
						tex.Y = tex.Y * cosrot + t * sinrot;
					}
					ds_xfrac = xs_RoundToInt(tex.X * scalex);
					ds_yfrac = xs_RoundToInt(tex.Y * scaley);

					R_DrawSpan();
#endif
				}
				x += xinc;
			}
		}
		y1 = y2;
		pt1 = pt2;
		pt2--;			if (pt2 < 0) pt2 = npoints;
	} while (pt1 != botpt);
	dc_destorg = destorgsave;
#endif
}